

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O1

void wasm::PostWalker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::scan
               (Recurser *self,Expression **currp)

{
  char *__function;
  Expression *currp_00;
  Expression *pEVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  _func_void_Recurser_ptr_Expression_ptr_ptr *local_40;
  Expression *local_38;
  
  pEVar1 = *currp;
  switch(pEVar1->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-delegations-fields.def"
                       ,0xb0);
  case BlockId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitBlock,currp
              );
    if (pEVar1->_id != BlockId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Block]";
LAB_006d37ca:
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                    ,0x314,__function);
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[2].type.id <= lVar4 - 2U) {
LAB_006d3467:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
                  ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case IfId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitIf,currp);
    if (pEVar1->_id != IfId) {
      __function = "T *wasm::Expression::cast() [T = wasm::If]";
      goto LAB_006d37ca;
    }
    local_38 = pEVar1 + 2;
    local_40 = scan;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::TypeUpdater::noteRecursiveRemoval(wasm::Expression*)::Recurser,wasm::UnifiedExpressionVisitor<wasm::TypeUpdater::noteRecursiveRemoval(wasm::Expression*)::Recurser,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::TypeUpdater::noteRecursiveRemoval(wasm::Expression*)::Recurser*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::TypeUpdater::noteRecursiveRemoval(wasm::Expression*)::Recurser,wasm::UnifiedExpressionVisitor<wasm::TypeUpdater::noteRecursiveRemoval(wasm::Expression*)::Recurser,void>>::Task,10ul>
                  *)&(self->
                     super_PostWalker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>).
                     super_Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               (Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_006d3450;
  case LoopId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitLoop,currp)
    ;
    if (pEVar1->_id != LoopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Loop]";
      goto LAB_006d37ca;
    }
    goto LAB_006d3038;
  case BreakId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitBreak,currp
              );
    if (pEVar1->_id != BreakId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Break]";
      goto LAB_006d37ca;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::TypeUpdater::noteRecursiveRemoval(wasm::Expression*)::Recurser,wasm::UnifiedExpressionVisitor<wasm::TypeUpdater::noteRecursiveRemoval(wasm::Expression*)::Recurser,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::TypeUpdater::noteRecursiveRemoval(wasm::Expression*)::Recurser*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::TypeUpdater::noteRecursiveRemoval(wasm::Expression*)::Recurser,wasm::UnifiedExpressionVisitor<wasm::TypeUpdater::noteRecursiveRemoval(wasm::Expression*)::Recurser,void>>::Task,10ul>
                  *)&(self->
                     super_PostWalker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>).
                     super_Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    if (*(long *)(pEVar1 + 2) == 0) {
      return;
    }
    goto LAB_006d2c8b;
  case SwitchId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitSwitch,
               currp);
    if (pEVar1->_id != SwitchId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Switch]";
      goto LAB_006d37ca;
    }
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               (Expression **)&pEVar1[4].type);
    local_38 = pEVar1 + 4;
    lVar5 = *(long *)(pEVar1 + 4);
    goto joined_r0x006d2a3a;
  case CallId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitCall,currp)
    ;
    if (pEVar1->_id != CallId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Call]";
      goto LAB_006d37ca;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_006d3467;
        Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
                  ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case CallIndirectId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::
               doVisitCallIndirect,currp);
    if (pEVar1->_id != CallIndirectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallIndirect]";
      goto LAB_006d37ca;
    }
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               (Expression **)&pEVar1[3].type);
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 2)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 2) & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (*(ulong *)(pEVar1 + 2) <= lVar4 - 2U) goto LAB_006d3467;
        Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
                  ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
                   (Expression **)(pEVar1[1].type.id + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case LocalGetId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitLocalGet,
               currp);
    if (pEVar1->_id != LocalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalGet]";
      goto LAB_006d37ca;
    }
    break;
  case LocalSetId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitLocalSet,
               currp);
    if (pEVar1->_id != LocalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalSet]";
      goto LAB_006d37ca;
    }
    goto LAB_006d3126;
  case GlobalGetId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitGlobalGet,
               currp);
    if (pEVar1->_id != GlobalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalGet]";
      goto LAB_006d37ca;
    }
    break;
  case GlobalSetId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitGlobalSet,
               currp);
    if (pEVar1->_id != GlobalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalSet]";
      goto LAB_006d37ca;
    }
    goto LAB_006d3038;
  case LoadId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitLoad,currp)
    ;
    if (pEVar1->_id != LoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Load]";
      goto LAB_006d37ca;
    }
    pEVar1 = pEVar1 + 3;
    goto LAB_006d33a1;
  case StoreId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitStore,currp
              );
    if (pEVar1->_id != StoreId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Store]";
      goto LAB_006d37ca;
    }
    goto LAB_006d30ef;
  case ConstId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitConst,currp
              );
    if (pEVar1->_id != ConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Const]";
      goto LAB_006d37ca;
    }
    break;
  case UnaryId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitUnary,currp
              );
    if (pEVar1->_id != UnaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unary]";
      goto LAB_006d37ca;
    }
    goto LAB_006d3126;
  case BinaryId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitBinary,
               currp);
    if (pEVar1->_id != BinaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Binary]";
      goto LAB_006d37ca;
    }
    goto LAB_006d3381;
  case SelectId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitSelect,
               currp);
    if (pEVar1->_id != SelectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Select]";
      goto LAB_006d37ca;
    }
    goto LAB_006d2d5b;
  case DropId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitDrop,currp)
    ;
    if (pEVar1->_id != DropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Drop]";
      goto LAB_006d37ca;
    }
    goto LAB_006d3359;
  case ReturnId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitReturn,
               currp);
    if (pEVar1->_id != ReturnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Return]";
      goto LAB_006d37ca;
    }
    goto LAB_006d2a31;
  case MemorySizeId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitMemorySize,
               currp);
    if (pEVar1->_id != MemorySizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemorySize]";
      goto LAB_006d37ca;
    }
    break;
  case MemoryGrowId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitMemoryGrow,
               currp);
    if (pEVar1->_id != MemoryGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryGrow]";
      goto LAB_006d37ca;
    }
    goto LAB_006d3359;
  case NopId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitNop,currp);
    if (pEVar1->_id != NopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Nop]";
      goto LAB_006d37ca;
    }
    break;
  case UnreachableId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitUnreachable
               ,currp);
    if (pEVar1->_id != UnreachableId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unreachable]";
      goto LAB_006d37ca;
    }
    break;
  case AtomicRMWId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitAtomicRMW,
               currp);
    if (pEVar1->_id != AtomicRMWId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicRMW]";
      goto LAB_006d37ca;
    }
    goto LAB_006d31c5;
  case AtomicCmpxchgId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::
               doVisitAtomicCmpxchg,currp);
    if (pEVar1->_id != AtomicCmpxchgId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicCmpxchg]";
      goto LAB_006d37ca;
    }
    goto LAB_006d31ab;
  case AtomicWaitId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitAtomicWait,
               currp);
    if (pEVar1->_id != AtomicWaitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicWait]";
      goto LAB_006d37ca;
    }
    goto LAB_006d28c8;
  case AtomicNotifyId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::
               doVisitAtomicNotify,currp);
    if (pEVar1->_id != AtomicNotifyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicNotify]";
      goto LAB_006d37ca;
    }
    goto LAB_006d3381;
  case AtomicFenceId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitAtomicFence
               ,currp);
    if (pEVar1->_id != AtomicFenceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicFence]";
      goto LAB_006d37ca;
    }
    break;
  case SIMDExtractId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitSIMDExtract
               ,currp);
    if (pEVar1->_id != SIMDExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDExtract]";
      goto LAB_006d37ca;
    }
    goto LAB_006d3126;
  case SIMDReplaceId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitSIMDReplace
               ,currp);
    if (pEVar1->_id != SIMDReplaceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDReplace]";
      goto LAB_006d37ca;
    }
    currp_00 = (Expression *)&pEVar1[2].type;
    goto LAB_006d338c;
  case SIMDShuffleId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitSIMDShuffle
               ,currp);
    if (pEVar1->_id != SIMDShuffleId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShuffle]";
      goto LAB_006d37ca;
    }
    goto LAB_006d32ff;
  case SIMDTernaryId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitSIMDTernary
               ,currp);
    if (pEVar1->_id != SIMDTernaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDTernary]";
      goto LAB_006d37ca;
    }
    goto LAB_006d28c8;
  case SIMDShiftId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitSIMDShift,
               currp);
    if (pEVar1->_id != SIMDShiftId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShift]";
      goto LAB_006d37ca;
    }
    goto LAB_006d3381;
  case SIMDLoadId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitSIMDLoad,
               currp);
    if (pEVar1->_id != SIMDLoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoad]";
      goto LAB_006d37ca;
    }
    goto LAB_006d2f6d;
  case SIMDLoadStoreLaneId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::
               doVisitSIMDLoadStoreLane,currp);
    if (pEVar1->_id != SIMDLoadStoreLaneId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoadStoreLane]";
      goto LAB_006d37ca;
    }
LAB_006d30ef:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               (Expression **)&pEVar1[3].type);
    pEVar1 = pEVar1 + 3;
    goto LAB_006d33a1;
  case MemoryInitId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitMemoryInit,
               currp);
    if (pEVar1->_id != MemoryInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryInit]";
      goto LAB_006d37ca;
    }
LAB_006d31ab:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 3));
    goto LAB_006d31c5;
  case DataDropId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitDataDrop,
               currp);
    if (pEVar1->_id != DataDropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::DataDrop]";
      goto LAB_006d37ca;
    }
    break;
  case MemoryCopyId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitMemoryCopy,
               currp);
    if (pEVar1->_id != MemoryCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryCopy]";
      goto LAB_006d37ca;
    }
    goto LAB_006d2d5b;
  case MemoryFillId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitMemoryFill,
               currp);
    if (pEVar1->_id != MemoryFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryFill]";
      goto LAB_006d37ca;
    }
    goto LAB_006d2d5b;
  case PopId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitPop,currp);
    if (pEVar1->_id != PopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Pop]";
      goto LAB_006d37ca;
    }
    break;
  case RefNullId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitRefNull,
               currp);
    if (pEVar1->_id != RefNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefNull]";
      goto LAB_006d37ca;
    }
    break;
  case RefIsNullId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitRefIsNull,
               currp);
    if (pEVar1->_id != RefIsNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefIsNull]";
      goto LAB_006d37ca;
    }
    goto LAB_006d3359;
  case RefFuncId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitRefFunc,
               currp);
    if (pEVar1->_id != RefFuncId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefFunc]";
      goto LAB_006d37ca;
    }
    break;
  case RefEqId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitRefEq,currp
              );
    if (pEVar1->_id != RefEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefEq]";
      goto LAB_006d37ca;
    }
    goto LAB_006d32ff;
  case TableGetId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitTableGet,
               currp);
    if (pEVar1->_id != TableGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGet]";
      goto LAB_006d37ca;
    }
    goto LAB_006d3038;
  case TableSetId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitTableSet,
               currp);
    if (pEVar1->_id != TableSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSet]";
      goto LAB_006d37ca;
    }
    goto LAB_006d31c5;
  case TableSizeId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitTableSize,
               currp);
    if (pEVar1->_id != TableSizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSize]";
      goto LAB_006d37ca;
    }
    break;
  case TableGrowId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitTableGrow,
               currp);
    if (pEVar1->_id != TableGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGrow]";
      goto LAB_006d37ca;
    }
LAB_006d31c5:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               (Expression **)&pEVar1[2].type);
    pEVar1 = pEVar1 + 2;
    goto LAB_006d33a1;
  case TryId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitTry,currp);
    if (pEVar1->_id != TryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Try]";
      goto LAB_006d37ca;
    }
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 5)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 5) & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (*(ulong *)(pEVar1 + 5) <= lVar4 - 2U) goto LAB_006d3467;
        Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
                  ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
                   (Expression **)(pEVar1[4].type.id + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
LAB_006d3038:
    pEVar1 = pEVar1 + 2;
    goto LAB_006d33a1;
  case ThrowId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitThrow,currp
              );
    if (pEVar1->_id != ThrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Throw]";
      goto LAB_006d37ca;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[2].type.id <= lVar4 - 2U) goto LAB_006d3467;
        Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
                  ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case RethrowId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitRethrow,
               currp);
    if (pEVar1->_id != RethrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Rethrow]";
      goto LAB_006d37ca;
    }
    break;
  case TupleMakeId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitTupleMake,
               currp);
    if (pEVar1->_id != TupleMakeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleMake]";
      goto LAB_006d37ca;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_006d3467;
        Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
                  ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case TupleExtractId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::
               doVisitTupleExtract,currp);
    if (pEVar1->_id != TupleExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleExtract]";
      goto LAB_006d37ca;
    }
    goto LAB_006d3359;
  case I31NewId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitI31New,
               currp);
    if (pEVar1->_id != I31NewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31New]";
      goto LAB_006d37ca;
    }
    goto LAB_006d3359;
  case I31GetId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitI31Get,
               currp);
    if (pEVar1->_id != I31GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31Get]";
      goto LAB_006d37ca;
    }
    goto LAB_006d3359;
  case CallRefId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitCallRef,
               currp);
    if (pEVar1->_id != CallRefId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallRef]";
      goto LAB_006d37ca;
    }
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 3));
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_006d3467;
        Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
                  ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case RefTestId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitRefTest,
               currp);
    if (pEVar1->_id != RefTestId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefTest]";
      goto LAB_006d37ca;
    }
    goto LAB_006d3359;
  case RefCastId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitRefCast,
               currp);
    if (pEVar1->_id != RefCastId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefCast]";
      goto LAB_006d37ca;
    }
    goto LAB_006d3359;
  case BrOnId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitBrOn,currp)
    ;
    if (pEVar1->_id != BrOnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::BrOn]";
      goto LAB_006d37ca;
    }
LAB_006d2f6d:
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_006d33a1;
  case StructNewId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitStructNew,
               currp);
    if (pEVar1->_id != StructNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructNew]";
      goto LAB_006d37ca;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_006d3467;
        Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
                  ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case StructGetId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitStructGet,
               currp);
    if (pEVar1->_id != StructGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructGet]";
      goto LAB_006d37ca;
    }
    goto LAB_006d3126;
  case StructSetId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitStructSet,
               currp);
    if (pEVar1->_id != StructSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructSet]";
      goto LAB_006d37ca;
    }
    goto LAB_006d3381;
  case ArrayNewId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitArrayNew,
               currp);
    if (pEVar1->_id != ArrayNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNew]";
      goto LAB_006d37ca;
    }
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               (Expression **)&pEVar1[1].type);
LAB_006d2a31:
    local_38 = pEVar1 + 1;
    lVar5 = *(long *)(pEVar1 + 1);
joined_r0x006d2a3a:
    if (lVar5 != 0) {
LAB_006d2c8b:
      local_40 = scan;
      SmallVector<wasm::Walker<wasm::TypeUpdater::noteRecursiveRemoval(wasm::Expression*)::Recurser,wasm::UnifiedExpressionVisitor<wasm::TypeUpdater::noteRecursiveRemoval(wasm::Expression*)::Recurser,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::TypeUpdater::noteRecursiveRemoval(wasm::Expression*)::Recurser*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::TypeUpdater::noteRecursiveRemoval(wasm::Expression*)::Recurser,wasm::UnifiedExpressionVisitor<wasm::TypeUpdater::noteRecursiveRemoval(wasm::Expression*)::Recurser,void>>::Task,10ul>
                  *)&(self->
                     super_PostWalker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>).
                     super_Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    break;
  case ArrayNewSegId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitArrayNewSeg
               ,currp);
    if (pEVar1->_id != ArrayNewSegId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewSeg]";
      goto LAB_006d37ca;
    }
    goto LAB_006d2ad9;
  case ArrayNewFixedId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::
               doVisitArrayNewFixed,currp);
    if (pEVar1->_id != ArrayNewFixedId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewFixed]";
      goto LAB_006d37ca;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_006d3467;
        Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
                  ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case ArrayGetId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitArrayGet,
               currp);
    if (pEVar1->_id != ArrayGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayGet]";
      goto LAB_006d37ca;
    }
    goto LAB_006d32ff;
  case ArraySetId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitArraySet,
               currp);
    if (pEVar1->_id != ArraySetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArraySet]";
      goto LAB_006d37ca;
    }
    goto LAB_006d2d5b;
  case ArrayLenId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitArrayLen,
               currp);
    if (pEVar1->_id != ArrayLenId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayLen]";
      goto LAB_006d37ca;
    }
    goto LAB_006d3359;
  case ArrayCopyId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitArrayCopy,
               currp);
    if (pEVar1->_id != ArrayCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayCopy]";
      goto LAB_006d37ca;
    }
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 3));
    goto LAB_006d286a;
  case ArrayFillId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitArrayFill,
               currp);
    if (pEVar1->_id != ArrayFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayFill]";
      goto LAB_006d37ca;
    }
LAB_006d286a:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               (Expression **)&pEVar1[2].type);
    goto LAB_006d2d5b;
  case ArrayInitId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitArrayInit,
               currp);
    if (pEVar1->_id != ArrayInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInit]";
      goto LAB_006d37ca;
    }
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 4));
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               (Expression **)&pEVar1[3].type);
LAB_006d2ad9:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 3));
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_006d33a1;
  case RefAsId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitRefAs,currp
              );
    if (pEVar1->_id != RefAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefAs]";
      goto LAB_006d37ca;
    }
    goto LAB_006d3126;
  case StringNewId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitStringNew,
               currp);
    if (pEVar1->_id != StringNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringNew]";
      goto LAB_006d37ca;
    }
    local_38 = pEVar1 + 3;
    local_40 = scan;
    if (*(long *)(pEVar1 + 3) != 0) {
      SmallVector<wasm::Walker<wasm::TypeUpdater::noteRecursiveRemoval(wasm::Expression*)::Recurser,wasm::UnifiedExpressionVisitor<wasm::TypeUpdater::noteRecursiveRemoval(wasm::Expression*)::Recurser,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::TypeUpdater::noteRecursiveRemoval(wasm::Expression*)::Recurser*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::TypeUpdater::noteRecursiveRemoval(wasm::Expression*)::Recurser,wasm::UnifiedExpressionVisitor<wasm::TypeUpdater::noteRecursiveRemoval(wasm::Expression*)::Recurser,void>>::Task,10ul>
                  *)&(self->
                     super_PostWalker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>).
                     super_Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::TypeUpdater::noteRecursiveRemoval(wasm::Expression*)::Recurser,wasm::UnifiedExpressionVisitor<wasm::TypeUpdater::noteRecursiveRemoval(wasm::Expression*)::Recurser,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::TypeUpdater::noteRecursiveRemoval(wasm::Expression*)::Recurser*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::TypeUpdater::noteRecursiveRemoval(wasm::Expression*)::Recurser,wasm::UnifiedExpressionVisitor<wasm::TypeUpdater::noteRecursiveRemoval(wasm::Expression*)::Recurser,void>>::Task,10ul>
                  *)&(self->
                     super_PostWalker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>).
                     super_Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    local_40 = scan;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::TypeUpdater::noteRecursiveRemoval(wasm::Expression*)::Recurser,wasm::UnifiedExpressionVisitor<wasm::TypeUpdater::noteRecursiveRemoval(wasm::Expression*)::Recurser,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::TypeUpdater::noteRecursiveRemoval(wasm::Expression*)::Recurser*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::TypeUpdater::noteRecursiveRemoval(wasm::Expression*)::Recurser,wasm::UnifiedExpressionVisitor<wasm::TypeUpdater::noteRecursiveRemoval(wasm::Expression*)::Recurser,void>>::Task,10ul>
                  *)&(self->
                     super_PostWalker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>).
                     super_Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_006d3450;
  case StringConstId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitStringConst
               ,currp);
    if (pEVar1->_id != StringConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConst]";
      goto LAB_006d37ca;
    }
    break;
  case StringMeasureId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::
               doVisitStringMeasure,currp);
    if (pEVar1->_id != StringMeasureId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringMeasure]";
      goto LAB_006d37ca;
    }
    goto LAB_006d3126;
  case StringEncodeId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::
               doVisitStringEncode,currp);
    if (pEVar1->_id != StringEncodeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEncode]";
      goto LAB_006d37ca;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::TypeUpdater::noteRecursiveRemoval(wasm::Expression*)::Recurser,wasm::UnifiedExpressionVisitor<wasm::TypeUpdater::noteRecursiveRemoval(wasm::Expression*)::Recurser,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::TypeUpdater::noteRecursiveRemoval(wasm::Expression*)::Recurser*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::TypeUpdater::noteRecursiveRemoval(wasm::Expression*)::Recurser,wasm::UnifiedExpressionVisitor<wasm::TypeUpdater::noteRecursiveRemoval(wasm::Expression*)::Recurser,void>>::Task,10ul>
                  *)&(self->
                     super_PostWalker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>).
                     super_Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 2));
    pEVar1 = (Expression *)&pEVar1[1].type;
LAB_006d3450:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               (Expression **)pEVar1);
    break;
  case StringConcatId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::
               doVisitStringConcat,currp);
    if (pEVar1->_id != StringConcatId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConcat]";
      goto LAB_006d37ca;
    }
    goto LAB_006d32ff;
  case StringEqId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitStringEq,
               currp);
    if (pEVar1->_id != StringEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEq]";
      goto LAB_006d37ca;
    }
    goto LAB_006d3381;
  case StringAsId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::doVisitStringAs,
               currp);
    if (pEVar1->_id != StringAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringAs]";
      goto LAB_006d37ca;
    }
LAB_006d3126:
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_006d33a1;
  case StringWTF8AdvanceId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::
               doVisitStringWTF8Advance,currp);
    if (pEVar1->_id != StringWTF8AdvanceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF8Advance]";
      goto LAB_006d37ca;
    }
LAB_006d2d5b:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 2));
    goto LAB_006d32ff;
  case StringWTF16GetId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::
               doVisitStringWTF16Get,currp);
    if (pEVar1->_id != StringWTF16GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF16Get]";
      goto LAB_006d37ca;
    }
    goto LAB_006d32ff;
  case StringIterNextId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::
               doVisitStringIterNext,currp);
    if (pEVar1->_id != StringIterNextId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringIterNext]";
      goto LAB_006d37ca;
    }
LAB_006d3359:
    pEVar1 = pEVar1 + 1;
LAB_006d33a1:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               (Expression **)pEVar1);
    return;
  case StringIterMoveId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::
               doVisitStringIterMove,currp);
    if (pEVar1->_id != StringIterMoveId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringIterMove]";
      goto LAB_006d37ca;
    }
LAB_006d3381:
    currp_00 = pEVar1 + 2;
LAB_006d338c:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               (Expression **)currp_00);
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_006d33a1;
  case StringSliceWTFId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::
               doVisitStringSliceWTF,currp);
    if (pEVar1->_id != StringSliceWTFId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceWTF]";
      goto LAB_006d37ca;
    }
LAB_006d28c8:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               (Expression **)&pEVar1[2].type);
    currp_00 = pEVar1 + 2;
    goto LAB_006d338c;
  case StringSliceIterId:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,
               Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::
               doVisitStringSliceIter,currp);
    if (pEVar1->_id != StringSliceIterId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceIter]";
      goto LAB_006d37ca;
    }
LAB_006d32ff:
    Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::pushTask
              ((Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_> *)self,scan,
               (Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_006d33a1;
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_INT_ARRAY(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_NAME_VECTOR(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE_VECTOR(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }